

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

char * trex_matchnode(TRex *exp,TRexNode *node,char *str,TRexNode *next)

{
  char cVar1;
  TRexMatch *pTVar2;
  TRexBool TVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  TRexNode *pTVar8;
  ushort **ppuVar9;
  char *pcVar10;
  char *pcVar11;
  uint uVar12;
  TRexNode *pTVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  bool bVar20;
  
  iVar7 = node->type;
  switch(iVar7) {
  case 0x100:
    pTVar8 = next;
    if ((long)node->next != -1) {
      pTVar8 = exp->_nodes + node->next;
    }
    uVar12 = (uint)node->right >> 0x10;
    uVar16 = node->right & 0xffff;
    uVar15 = 1;
    uVar17 = 0;
    do {
      uVar19 = uVar15 - 1;
      uVar18 = uVar19;
      if ((uVar16 <= uVar19 && uVar15 != 0x10000) ||
         (pcVar10 = trex_matchnode(exp,exp->_nodes + node->left,str,pTVar8), uVar18 = uVar17,
         pcVar10 == (char *)0x0)) break;
      str = pcVar10;
      if ((pTVar8 != (TRexNode *)0x0) && ((pTVar8->type != 0x100 || (0xffff < (uint)pTVar8->right)))
         ) {
        iVar7 = pTVar8->next;
        if ((iVar7 == -1) && ((next == (TRexNode *)0x0 || (iVar7 = next->next, iVar7 == -1)))) {
          pTVar13 = (TRexNode *)0x0;
        }
        else {
          pTVar13 = exp->_nodes + iVar7;
        }
        pcVar11 = trex_matchnode(exp,pTVar8,pcVar10,pTVar13);
        if (pcVar11 != (char *)0x0) {
          uVar18 = uVar12;
          if (uVar12 == uVar15 && uVar12 == uVar16) break;
          if ((uVar12 <= uVar15) && (uVar18 = uVar15, uVar16 == 0xffff || uVar19 < uVar16)) break;
        }
      }
      uVar15 = uVar15 + 1;
      uVar18 = uVar17 + 1;
      uVar17 = uVar18;
    } while (pcVar10 < exp->_eol);
    if ((uVar12 != uVar18 || uVar12 != uVar16) && (uVar16 != 0xffff || (int)uVar18 < (int)uVar12)) {
      if ((int)uVar16 < (int)uVar18) {
        str = (char *)0x0;
      }
      if ((int)uVar18 < (int)uVar12) {
        str = (char *)0x0;
      }
    }
    break;
  case 0x101:
    pTVar8 = exp->_nodes + node->left;
    pcVar10 = str;
    while (pcVar10 = trex_matchnode(exp,pTVar8,pcVar10,(TRexNode *)0x0), pcVar10 != (char *)0x0) {
      if ((long)pTVar8->next == -1) {
        return pcVar10;
      }
      pTVar8 = exp->_nodes + pTVar8->next;
    }
    pTVar8 = exp->_nodes + node->right;
    pcVar10 = trex_matchnode(exp,pTVar8,str,(TRexNode *)0x0);
    str = (char *)0x0;
    if (pcVar10 != (char *)0x0) {
      do {
        if ((long)pTVar8->next == -1) {
          return pcVar10;
        }
        pTVar8 = exp->_nodes + pTVar8->next;
        pcVar10 = trex_matchnode(exp,pTVar8,pcVar10,(TRexNode *)0x0);
        str = (char *)0x0;
      } while (pcVar10 != (char *)0x0);
    }
    break;
  case 0x102:
  case 0x103:
    pTVar8 = exp->_nodes;
    iVar6 = node->left;
    iVar14 = -1;
    if ((iVar7 != 0x103) && (iVar7 = node->right, iVar7 == exp->_currsubexp)) {
      exp->_matches[iVar7].begin = str;
      exp->_currsubexp = iVar7 + 1;
      iVar14 = iVar7;
    }
    pTVar13 = pTVar8 + iVar6;
    do {
      pTVar8 = pTVar8 + pTVar13->next;
      if ((long)pTVar13->next == -1) {
        pTVar8 = next;
      }
      str = trex_matchnode(exp,pTVar13,str,pTVar8);
      if (str == (char *)0x0) {
        if (iVar14 == -1) {
          return (char *)0x0;
        }
        pTVar2 = exp->_matches;
        pTVar2[iVar14].begin = (char *)0x0;
        pTVar2[iVar14].len = 0;
        return (char *)0x0;
      }
      if ((long)pTVar13->next == -1) break;
      pTVar8 = exp->_nodes;
      pTVar13 = pTVar8 + pTVar13->next;
    } while (pTVar8 != (TRexNode *)0x0);
    if (iVar14 != -1) {
      exp->_matches[iVar14].len = (int)str - *(int *)&exp->_matches[iVar14].begin;
    }
    break;
  case 0x104:
    goto switchD_00106548_caseD_104;
  case 0x105:
  case 0x107:
    pTVar8 = exp->_nodes;
    iVar6 = node->left;
    cVar1 = *str;
    iVar14 = (int)cVar1;
    do {
      iVar5 = pTVar8[iVar6].type;
      if (iVar5 == 0x106) {
        TVar3 = trex_matchcclass(pTVar8[iVar6].left,cVar1);
        if (TVar3 != 0) {
LAB_001066d5:
          if (iVar7 != 0x105) {
            return (char *)0x0;
          }
          goto switchD_00106548_caseD_104;
        }
      }
      else if (iVar5 == 0x108) {
        iVar5 = pTVar8[iVar6].left;
        if ((exp->_flags & 1) == 0) {
          if (iVar5 <= iVar14) {
            iVar5 = pTVar8[iVar6].right;
joined_r0x0010663f:
            if (iVar14 <= iVar5) goto LAB_001066d5;
          }
        }
        else {
          iVar4 = toupper(iVar5);
          if ((iVar4 <= iVar14) && (iVar4 = toupper(pTVar8[iVar6].right), iVar14 <= iVar4))
          goto LAB_001066d5;
          iVar5 = tolower(iVar5);
          if (iVar5 <= iVar14) {
            iVar5 = tolower(pTVar8[iVar6].right);
            goto joined_r0x0010663f;
          }
        }
      }
      else {
        if ((exp->_flags & 1) != 0) {
          iVar4 = tolower(iVar5);
          if (iVar4 == iVar14) goto LAB_001066d5;
          iVar5 = toupper(iVar5);
        }
        if (iVar5 == iVar14) goto LAB_001066d5;
      }
    } while ((pTVar8 != (TRexNode *)0x0) && (iVar6 = pTVar8[iVar6].next, iVar6 != -1));
    if (iVar7 != 0x107) {
      return (char *)0x0;
    }
    goto switchD_00106548_caseD_104;
  case 0x106:
    TVar3 = trex_matchcclass(node->left,*str);
    str = str + 1;
    if (TVar3 == 0) {
      str = (char *)0x0;
    }
    break;
  default:
    cVar1 = *str;
    if ((exp->_flags & 1) != 0) {
      iVar6 = tolower(iVar7);
      if (iVar6 == cVar1) goto switchD_00106548_caseD_104;
      iVar7 = toupper(iVar7);
    }
    if (iVar7 != cVar1) {
      return (char *)0x0;
    }
switchD_00106548_caseD_104:
    str = str + 1;
    break;
  case 0x10a:
    bVar20 = exp->_eol == str;
    goto LAB_00106775;
  case 0x10b:
    bVar20 = exp->_bol == str;
    goto LAB_00106775;
  case 0x10c:
    if ((((exp->_bol != str) ||
         (ppuVar9 = __ctype_b_loc(), (*(byte *)((long)*ppuVar9 + (long)*str * 2 + 1) & 0x20) != 0))
        && ((pcVar10 = exp->_eol, ppuVar9 = __ctype_b_loc(), pcVar10 != str ||
            ((*(byte *)((long)*ppuVar9 + (long)str[-1] * 2 + 1) & 0x20) != 0)))) &&
       (((*(byte *)((long)*ppuVar9 + (long)*str * 2 + 1) & 0x20) == 0) ==
        ((*(byte *)((long)*ppuVar9 + (long)str[1] * 2 + 1) & 0x20) == 0))) {
      if (node->left == 0x62) {
        return (char *)0x0;
      }
      return str;
    }
    bVar20 = node->left == 0x62;
LAB_00106775:
    if (!bVar20) {
      str = (char *)0x0;
    }
  }
  return str;
}

Assistant:

static const TRexChar * trex_matchnode(TRex * exp, TRexNode * node, const TRexChar * str, TRexNode * next) {

	TRexNodeType type = node->type;

	switch (type) {
		case OP_GREEDY: {
			//TRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
			TRexNode * greedystop = NULL;
			int p0 = (node->right >> 16) & 0x0000FFFF, p1 = node->right & 0x0000FFFF, nmaches = 0;
			const TRexChar * s = str, *good = str;

			if (node->next != -1) {
				greedystop = &exp->_nodes[node->next];
			} else {
				greedystop = next;
			}

			while ((nmaches == 0xFFFF || nmaches < p1)) {

				const TRexChar * stop;

				if (!(s = trex_matchnode(exp, &exp->_nodes[node->left], s, greedystop))) {
					break;
				}

				nmaches++;
				good = s;

				if (greedystop) {
					//checks that 0 matches satisfy the expression(if so skips)
					//if not would always stop(for instance if is a '?')
					if (greedystop->type != OP_GREEDY ||
							(greedystop->type == OP_GREEDY && ((greedystop->right >> 16) & 0x0000FFFF) != 0)) {
						TRexNode * gnext = NULL;

						if (greedystop->next != -1) {
							gnext = &exp->_nodes[greedystop->next];
						} else if (next && next->next != -1) {
							gnext = &exp->_nodes[next->next];
						}

						stop = trex_matchnode(exp, greedystop, s, gnext);

						if (stop) {
							//if satisfied stop it
							if (p0 == p1 && p0 == nmaches) {
								break;
							} else if (nmaches >= p0 && p1 == 0xFFFF) {
								break;
							} else if (nmaches >= p0 && nmaches <= p1) {
								break;
							}
						}
					}
				}

				if (s >= exp->_eol) {
					break;
				}
			}

			if (p0 == p1 && p0 == nmaches) {
				return good;
			} else if (nmaches >= p0 && p1 == 0xFFFF) {
				return good;
			} else if (nmaches >= p0 && nmaches <= p1) {
				return good;
			}

			return NULL;
		}

		case OP_OR: {
			const TRexChar * asd = str;
			TRexNode * temp = &exp->_nodes[node->left];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			asd = str;
			temp = &exp->_nodes[node->right];

			while ( (asd = trex_matchnode(exp, temp, asd, NULL)) ) {
				if (temp->next != -1) {
					temp = &exp->_nodes[temp->next];
				} else {
					return asd;
				}
			}

			return NULL;
			break;
		}

		case OP_EXPR:
		case OP_NOCAPEXPR: {
			TRexNode * n = &exp->_nodes[node->left];
			const TRexChar * cur = str;
			int capture = -1;

			if (node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
				capture = exp->_currsubexp;
				exp->_matches[capture].begin = cur;
				exp->_currsubexp++;
			}

			do {
				TRexNode * subnext = NULL;

				if (n->next != -1) {
					subnext = &exp->_nodes[n->next];
				} else {
					subnext = next;
				}

				if (!(cur = trex_matchnode(exp, n, cur, subnext))) {
					if (capture != -1) {
						exp->_matches[capture].begin = 0;
						exp->_matches[capture].len = 0;
					}

					return NULL;
				}
			} while ((n->next != -1) && (n = &exp->_nodes[n->next]));

			if (capture != -1) {
				exp->_matches[capture].len = cur - exp->_matches[capture].begin;
			}

			return cur;
		}

		case OP_WB:
			if ((str == exp->_bol && !isspace(*str))
					|| ((str == exp->_eol && !isspace(*(str - 1))))
					|| ((!isspace(*str) && isspace(*(str + 1))))
					|| ((isspace(*str) && !isspace(*(str + 1)))) ) {
				return (node->left == 'b') ? str : NULL;
			}

			return (node->left == 'b') ? NULL : str;

		case OP_BOL:
			if (str == exp->_bol) {
				return str;
			}

			return NULL;

		case OP_EOL:
			if (str == exp->_eol) {
				return str;
			}

			return NULL;

		case OP_DOT:
			str++;
			return str;

		case OP_NCLASS:
		case OP_CLASS:
			if (trex_matchclass(exp, &exp->_nodes[node->left], *str) ? (type == OP_CLASS ? TRex_True : TRex_False) : (type == OP_NCLASS ? TRex_True : TRex_False)) {
				str++;
				return str;
			}

			return NULL;

		case OP_CCLASS:
			if (trex_matchcclass(node->left, *str)) {
				str++;
				return str;
			}

			return NULL;

		default: /* char */
			if (exp->_flags & TREX_ICASE) {
				if (*str != tolower(node->type) && *str != toupper(node->type)) {
					return NULL;
				}
			} else {
				if (*str != node->type) {
					return NULL;
				}
			}

			str++;
			return str;
	}

	return NULL;
}